

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::TransformIfCase::transform_block(StmtBlock *stmts)

{
  uint64_t this;
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  size_type sVar4;
  ulong uVar5;
  __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  StmtBlock *this_03;
  shared_ptr<kratos::Stmt> local_b0;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  shared_ptr<kratos::SwitchStmt> switch_stmt;
  bool has_else;
  uint64_t expected_case;
  uint64_t cases;
  undefined1 local_58 [8];
  vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
  if_stmts;
  Var *target;
  Stmt *local_28;
  element_type *stmt;
  uint64_t i;
  uint64_t stmt_count;
  StmtBlock *stmts_local;
  
  stmt_count = (uint64_t)stmts;
  i = StmtBlock::size(stmts);
  for (stmt = (element_type *)0x0; stmt < i;
      stmt = (element_type *)((long)&(stmt->super_IRNode)._vptr_IRNode + 1)) {
    StmtBlock::get_stmt((StmtBlock *)&target,stmt_count);
    peVar3 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)&target);
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&target);
    if_stmts.
    super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_28 = peVar3;
    std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
    ::vector((vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
              *)local_58);
    bVar1 = has_target_if(local_28,(Var **)&if_stmts.
                                            super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                           *)local_58);
    if ((bVar1) &&
       (if_stmts.
        super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
      sVar4 = std::
              vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
              ::size((vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                      *)local_58);
      bVar2 = (*(code *)((((if_stmts.
                            super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                        super_Stmt).super_IRNode.comment.field_2._M_allocated_capacity)();
      uVar5 = (ulong)(uint)(1 << (bVar2 & 0x1f));
      this_00 = (__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::
                vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                ::back((vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                        *)local_58);
      this_01 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_00);
      this_02 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)IfStmt::else_body(this_01);
      this_03 = &std::
                 __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_02)->super_StmtBlock;
      bVar1 = StmtBlock::empty(this_03);
      switch_stmt.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._7_1_ = (bVar1 ^ 0xffU) & 1;
      if ((1 < uVar5) &&
         ((uVar5 <= sVar4 ||
          (switch_stmt.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._7_1_ != 0)))) {
        Stmt::as<kratos::IfStmt>((Stmt *)local_a0);
        change_if_to_switch((TransformIfCase *)local_90,(shared_ptr<kratos::IfStmt> *)local_a0,
                            (vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                             *)local_58);
        std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_a0);
        this = stmt_count;
        peVar3 = stmt;
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::SwitchStmt,void>
                  (&local_b0,(shared_ptr<kratos::SwitchStmt> *)local_90);
        StmtBlock::set_child((StmtBlock *)this,(uint64_t)peVar3,&local_b0);
        std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_b0);
        std::shared_ptr<kratos::SwitchStmt>::~shared_ptr((shared_ptr<kratos::SwitchStmt> *)local_90)
        ;
      }
    }
    std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
    ::~vector((vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
               *)local_58);
  }
  return;
}

Assistant:

void static transform_block(StmtBlock* stmts) {
        auto const stmt_count = stmts->size();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto* stmt = stmts->get_stmt(i).get();
            Var* target = nullptr;
            std::vector<std::shared_ptr<IfStmt>> if_stmts;
            if (has_target_if(stmt, target, if_stmts) && target) {
                uint64_t cases = if_stmts.size();
                uint64_t expected_case = 1u << target->width();
                bool has_else = !(if_stmts.back()->else_body()->empty());
                if (expected_case > 1 && (cases >= expected_case || has_else)) {
                    auto switch_stmt = change_if_to_switch(stmt->as<IfStmt>(), if_stmts);
                    stmts->set_child(i, switch_stmt);
                }
            }
        }
    }